

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

_Bool imap_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  ulong uVar1;
  imapstate iVar2;
  IMAP *pIVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t __n;
  char *pcVar7;
  
  pIVar3 = (data->req).p.imap;
  pcVar7 = (conn->proto).imapc.resptag;
  __n = strlen(pcVar7);
  uVar1 = __n + 1;
  if (((uVar1 <= len) && (iVar5 = bcmp(pcVar7,line,__n), iVar5 == 0)) && (line[__n] == ' ')) {
    if (len - uVar1 < 2) {
LAB_0013ed51:
      iVar5 = 2;
    }
    else if (*(short *)(line + uVar1) == 0x4b4f) {
      iVar5 = 1;
    }
    else {
      if ((len - uVar1 < 7) ||
         (*(int *)(line + __n + 4) != 0x48545541 || *(int *)(line + uVar1) != 0x41455250))
      goto LAB_0013ed51;
      iVar5 = 3;
    }
    goto switchD_0013edb4_caseD_8;
  }
  if ((len < 2) || (*(short *)line != 0x202a)) {
    if ((pIVar3 != (IMAP *)0x0) && (pIVar3->custom == (char *)0x0)) {
      if (len == 3) {
        if (*line != '+') goto LAB_0013edc8;
LAB_0013edcf:
        iVar2 = (conn->proto).imapc.state;
        iVar5 = 0x2b;
        if ((iVar2 != IMAP_AUTHENTICATE) && (iVar2 != IMAP_APPEND)) {
          Curl_failf(data,"Unexpected continuation response");
          iVar5 = -1;
        }
        goto switchD_0013edb4_caseD_8;
      }
      if (1 < len) {
LAB_0013edc8:
        if (*(short *)line == 0x202b) goto LAB_0013edcf;
      }
    }
    goto LAB_0013ed78;
  }
  _Var4 = false;
  iVar5 = 0x2a;
  switch((conn->proto).imapc.state) {
  case IMAP_CAPABILITY:
    pcVar7 = "CAPABILITY";
    break;
  default:
    goto switchD_0013edb4_caseD_3;
  case IMAP_LIST:
    pcVar7 = pIVar3->custom;
    if (pcVar7 == (char *)0x0) {
      _Var4 = imap_matchresp(line,len,"LIST");
      if (!_Var4) goto LAB_0013ed78;
      pcVar7 = pIVar3->custom;
      if (pcVar7 == (char *)0x0) goto switchD_0013edb4_caseD_8;
    }
    _Var4 = imap_matchresp(line,len,pcVar7);
    if ((((!_Var4) &&
         ((((iVar6 = curl_strequal(pIVar3->custom,"STORE"), iVar6 == 0 ||
            (_Var4 = imap_matchresp(line,len,"FETCH"), !_Var4)) &&
           (iVar6 = curl_strequal(pIVar3->custom,"SELECT"), iVar6 == 0)) &&
          ((iVar6 = curl_strequal(pIVar3->custom,"EXAMINE"), iVar6 == 0 &&
           (iVar6 = curl_strequal(pIVar3->custom,"SEARCH"), iVar6 == 0)))))) &&
        (iVar6 = curl_strequal(pIVar3->custom,"EXPUNGE"), iVar6 == 0)) &&
       (((iVar6 = curl_strequal(pIVar3->custom,"LSUB"), iVar6 == 0 &&
         (iVar6 = curl_strequal(pIVar3->custom,"UID"), iVar6 == 0)) &&
        ((iVar6 = curl_strequal(pIVar3->custom,"GETQUOTAROOT"), iVar6 == 0 &&
         (iVar6 = curl_strequal(pIVar3->custom,"NOOP"), iVar6 == 0)))))) goto LAB_0013ed78;
  case IMAP_SELECT:
    goto switchD_0013edb4_caseD_8;
  case IMAP_FETCH:
    pcVar7 = "FETCH";
    break;
  case IMAP_SEARCH:
    pcVar7 = "SEARCH";
  }
  _Var4 = imap_matchresp(line,len,pcVar7);
  if (_Var4) {
switchD_0013edb4_caseD_8:
    *resp = iVar5;
    _Var4 = true;
  }
  else {
LAB_0013ed78:
    _Var4 = false;
  }
switchD_0013edb4_caseD_3:
  return _Var4;
}

Assistant:

static bool imap_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           const char *line, size_t len, int *resp)
{
  struct IMAP *imap = data->req.p.imap;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = IMAP_RESP_OK;
    else if(len >= 7 && !memcmp(line, "PREAUTH", 7))
      *resp = IMAP_RESP_PREAUTH;
    else
      *resp = IMAP_RESP_NOT_OK;

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (!strcasecompare(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           !strcasecompare(imap->custom, "SELECT") &&
           !strcasecompare(imap->custom, "EXAMINE") &&
           !strcasecompare(imap->custom, "SEARCH") &&
           !strcasecompare(imap->custom, "EXPUNGE") &&
           !strcasecompare(imap->custom, "LSUB") &&
           !strcasecompare(imap->custom, "UID") &&
           !strcasecompare(imap->custom, "GETQUOTAROOT") &&
           !strcasecompare(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some email servers ignore this and only send a single + instead. */
  if(imap && !imap->custom && ((len == 3 && line[0] == '+') ||
     (len >= 2 && !memcmp("+ ", line, 2)))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}